

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O2

void stbir__decode_scanline(stbir__info *stbir_info,int n)

{
  uint uVar1;
  uint uVar2;
  stbir_datatype sVar3;
  int iVar4;
  stbir_edge edge;
  stbir_edge edge_00;
  stbir_colorspace sVar5;
  void *pvVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  float *pfVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  float *pfVar21;
  long lVar22;
  float fVar23;
  
  uVar1 = stbir_info->channels;
  lVar16 = (long)(int)uVar1;
  uVar2 = stbir_info->alpha_channel;
  lVar10 = (long)(int)uVar2;
  sVar3 = stbir_info->type;
  iVar4 = stbir_info->input_w;
  lVar22 = (long)iVar4;
  iVar19 = stbir_info->input_stride_bytes;
  pfVar21 = stbir_info->decode_buffer;
  lVar11 = (long)(int)(stbir_info->horizontal_filter_pixel_margin * uVar1);
  edge = stbir_info->edge_horizontal;
  edge_00 = stbir_info->edge_vertical;
  sVar5 = stbir_info->colorspace;
  iVar8 = stbir__edge_wrap(edge_00,n,stbir_info->input_h);
  lVar12 = (long)iVar8 * (long)iVar19;
  pvVar6 = stbir_info->input_data;
  iVar19 = stbir_info->horizontal_filter_pixel_margin + iVar4;
  iVar8 = -stbir_info->horizontal_filter_pixel_margin;
  if ((edge_00 == STBIR_EDGE_ZERO) && ((n < 0 || (stbir_info->input_h <= n)))) {
    uVar13 = 0;
    if (0 < (int)uVar1) {
      uVar13 = (ulong)uVar1;
    }
    if (iVar19 < iVar8) {
      iVar19 = iVar8;
    }
    lVar10 = (long)iVar8;
    pfVar21 = pfVar21 + lVar16 * lVar10 + lVar11;
    for (; lVar10 != iVar19; lVar10 = lVar10 + 1) {
      for (uVar17 = 0; uVar13 != uVar17; uVar17 = uVar17 + 1) {
        pfVar21[uVar17] = 0.0;
      }
      pfVar21 = pfVar21 + lVar16;
    }
  }
  else {
    switch(sVar3 * 2 + sVar5) {
    case STBIR_COLORSPACE_LINEAR:
      uVar7 = 0;
      if (0 < (int)uVar1) {
        uVar7 = uVar1;
      }
      lVar18 = (long)iVar8;
      if (iVar8 <= iVar19) {
        iVar8 = iVar19;
      }
      pfVar15 = pfVar21 + lVar16 * lVar18 + lVar11;
      for (; lVar18 != iVar8; lVar18 = lVar18 + 1) {
        iVar9 = stbir__edge_wrap(edge,(int)lVar18,iVar4);
        for (uVar13 = 0; uVar7 != uVar13; uVar13 = uVar13 + 1) {
          pfVar15[uVar13] =
               (float)*(byte *)((long)pvVar6 + uVar13 + (int)(iVar9 * uVar1) + lVar12) / 255.0;
        }
        pfVar15 = pfVar15 + lVar16;
      }
      break;
    case STBIR_COLORSPACE_SRGB:
      uVar7 = 0;
      if (0 < (int)uVar1) {
        uVar7 = uVar1;
      }
      lVar18 = (long)iVar8;
      if (iVar8 <= iVar19) {
        iVar8 = iVar19;
      }
      pfVar15 = pfVar21 + lVar16 * lVar18 + lVar11;
      for (; lVar18 != iVar8; lVar18 = lVar18 + 1) {
        iVar9 = stbir__edge_wrap(edge,(int)lVar18,iVar4);
        for (uVar13 = 0; uVar7 != uVar13; uVar13 = uVar13 + 1) {
          pfVar15[uVar13] =
               stbir__srgb_uchar_to_linear_float
               [*(byte *)((long)pvVar6 + uVar13 + (int)(iVar9 * uVar1) + lVar12)];
        }
        if ((stbir_info->flags & 2) == 0) {
          pfVar21[lVar11 + lVar10 + lVar18 * lVar16] =
               (float)*(byte *)((long)pvVar6 + (int)(iVar9 * uVar1) + lVar10 + lVar12) / 255.0;
        }
        pfVar15 = pfVar15 + lVar16;
      }
      break;
    case STBIR_MAX_COLORSPACES:
      uVar7 = 0;
      if (0 < (int)uVar1) {
        uVar7 = uVar1;
      }
      lVar18 = (long)iVar8;
      if (iVar8 <= iVar19) {
        iVar8 = iVar19;
      }
      pfVar15 = pfVar21 + lVar16 * lVar18 + lVar11;
      for (; lVar18 != iVar8; lVar18 = lVar18 + 1) {
        iVar9 = stbir__edge_wrap(edge,(int)lVar18,iVar4);
        for (uVar13 = 0; uVar7 != uVar13; uVar13 = uVar13 + 1) {
          pfVar15[uVar13] =
               (float)*(ushort *)
                       ((long)pvVar6 + uVar13 * 2 + (long)(int)(iVar9 * uVar1) * 2 + lVar12) /
               65535.0;
        }
        pfVar15 = pfVar15 + lVar16;
      }
      break;
    case STBIR_MAX_COLORSPACES|STBIR_COLORSPACE_SRGB:
      uVar13 = 0;
      if (0 < (int)uVar1) {
        uVar13 = (ulong)uVar1;
      }
      lVar18 = (long)iVar8;
      if (iVar8 <= iVar19) {
        iVar8 = iVar19;
      }
      pfVar15 = pfVar21 + lVar16 * lVar18 + lVar11;
      for (; lVar18 != iVar8; lVar18 = lVar18 + 1) {
        iVar9 = stbir__edge_wrap(edge,(int)lVar18,iVar4);
        for (uVar17 = 0; uVar13 != uVar17; uVar17 = uVar17 + 1) {
          fVar23 = (float)*(ushort *)
                           ((long)pvVar6 + uVar17 * 2 + (long)(int)(iVar9 * uVar1) * 2 + lVar12) /
                   65535.0;
          if (fVar23 <= 0.04045) {
            fVar23 = fVar23 / 12.92;
          }
          else {
            fVar23 = powf((fVar23 + 0.055) / 1.055,2.4);
          }
          pfVar15[uVar17] = fVar23;
        }
        if ((stbir_info->flags & 2) == 0) {
          pfVar21[lVar11 + lVar10 + lVar18 * lVar16] =
               (float)*(ushort *)((long)pvVar6 + (long)(int)(iVar9 * uVar1 + uVar2) * 2 + lVar12) /
               65535.0;
        }
        pfVar15 = pfVar15 + lVar16;
      }
      break;
    case 4:
      uVar7 = 0;
      if (0 < (int)uVar1) {
        uVar7 = uVar1;
      }
      lVar18 = (long)iVar8;
      if (iVar8 <= iVar19) {
        iVar8 = iVar19;
      }
      pfVar15 = pfVar21 + lVar16 * lVar18 + lVar11;
      for (; lVar18 != iVar8; lVar18 = lVar18 + 1) {
        iVar9 = stbir__edge_wrap(edge,(int)lVar18,iVar4);
        for (uVar13 = 0; uVar7 != uVar13; uVar13 = uVar13 + 1) {
          pfVar15[uVar13] =
               (float)((double)*(uint *)((long)pvVar6 +
                                        uVar13 * 4 + (long)(int)(iVar9 * uVar1) * 4 + lVar12) /
                      4294967295.0);
        }
        pfVar15 = pfVar15 + lVar16;
      }
      break;
    case 5:
      uVar13 = 0;
      if (0 < (int)uVar1) {
        uVar13 = (ulong)uVar1;
      }
      lVar18 = (long)iVar8;
      if (iVar8 <= iVar19) {
        iVar8 = iVar19;
      }
      pfVar15 = pfVar21 + lVar16 * lVar18 + lVar11;
      for (; lVar18 != iVar8; lVar18 = lVar18 + 1) {
        iVar9 = stbir__edge_wrap(edge,(int)lVar18,iVar4);
        for (uVar17 = 0; uVar13 != uVar17; uVar17 = uVar17 + 1) {
          fVar23 = (float)((double)*(uint *)((long)pvVar6 +
                                            uVar17 * 4 + (long)(int)(iVar9 * uVar1) * 4 + lVar12) /
                          4294967295.0);
          if (fVar23 <= 0.04045) {
            fVar23 = fVar23 / 12.92;
          }
          else {
            fVar23 = powf((fVar23 + 0.055) / 1.055,2.4);
          }
          pfVar15[uVar17] = fVar23;
        }
        if ((stbir_info->flags & 2) == 0) {
          pfVar21[lVar11 + lVar10 + lVar18 * lVar16] =
               (float)((double)*(uint *)((long)pvVar6 +
                                        (long)(int)(iVar9 * uVar1 + uVar2) * 4 + lVar12) /
                      4294967295.0);
        }
        pfVar15 = pfVar15 + lVar16;
      }
      break;
    case 6:
      uVar7 = 0;
      if (0 < (int)uVar1) {
        uVar7 = uVar1;
      }
      lVar18 = (long)iVar8;
      if (iVar8 <= iVar19) {
        iVar8 = iVar19;
      }
      pfVar15 = pfVar21 + lVar16 * lVar18 + lVar11;
      for (; lVar18 != iVar8; lVar18 = lVar18 + 1) {
        iVar9 = stbir__edge_wrap(edge,(int)lVar18,iVar4);
        for (uVar13 = 0; uVar7 != uVar13; uVar13 = uVar13 + 1) {
          pfVar15[uVar13] =
               *(float *)((long)pvVar6 + uVar13 * 4 + (long)(int)(iVar9 * uVar1) * 4 + lVar12);
        }
        pfVar15 = pfVar15 + lVar16;
      }
      break;
    case 7:
      lVar18 = (long)iVar8;
      uVar13 = 0;
      if (0 < (int)uVar1) {
        uVar13 = (ulong)uVar1;
      }
      if (iVar8 <= iVar19) {
        iVar8 = iVar19;
      }
      pfVar15 = pfVar21 + lVar16 * lVar18 + lVar11;
      for (; lVar18 != iVar8; lVar18 = lVar18 + 1) {
        iVar9 = stbir__edge_wrap(edge,(int)lVar18,iVar4);
        for (uVar17 = 0; uVar13 != uVar17; uVar17 = uVar17 + 1) {
          fVar23 = *(float *)((long)pvVar6 + uVar17 * 4 + (long)(int)(iVar9 * uVar1) * 4 + lVar12);
          if (fVar23 <= 0.04045) {
            fVar23 = fVar23 / 12.92;
          }
          else {
            fVar23 = powf((fVar23 + 0.055) / 1.055,2.4);
          }
          pfVar15[uVar17] = fVar23;
        }
        if ((stbir_info->flags & 2) == 0) {
          pfVar21[lVar11 + lVar10 + lVar18 * lVar16] =
               *(float *)((long)pvVar6 + (long)(int)(iVar9 * uVar1 + uVar2) * 4 + lVar12);
        }
        pfVar15 = pfVar15 + lVar16;
      }
      break;
    default:
      __assert_fail("!\"Unknown type/colorspace/channels combination.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                    ,0x559,"void stbir__decode_scanline(stbir__info *, int)");
    }
    if ((stbir_info->flags & 1) == 0) {
      uVar13 = 0;
      iVar4 = -stbir_info->horizontal_filter_pixel_margin;
      if (0 < (int)uVar1) {
        uVar13 = (ulong)uVar1;
      }
      lVar12 = (long)iVar4;
      iVar8 = iVar19;
      if (iVar19 < iVar4) {
        iVar8 = iVar4;
      }
      pfVar15 = pfVar21 + lVar16 * lVar12 + lVar11;
      for (; lVar12 != iVar8; lVar12 = lVar12 + 1) {
        fVar23 = pfVar21[lVar11 + lVar10 + lVar12 * lVar16];
        if (stbir_info->type != STBIR_TYPE_FLOAT) {
          fVar23 = fVar23 + 8.271806e-25;
          pfVar21[lVar11 + lVar10 + lVar12 * lVar16] = fVar23;
        }
        for (uVar17 = 0; uVar13 != uVar17; uVar17 = uVar17 + 1) {
          if (uVar2 != uVar17) {
            pfVar15[uVar17] = pfVar15[uVar17] * fVar23;
          }
        }
        pfVar15 = pfVar15 + lVar16;
      }
    }
    if (edge == STBIR_EDGE_ZERO) {
      uVar17 = 0;
      uVar2 = -stbir_info->horizontal_filter_pixel_margin;
      uVar13 = 0;
      if (0 < (int)uVar1) {
        uVar13 = (ulong)uVar1;
      }
      uVar14 = (ulong)(int)uVar2;
      if (stbir_info->horizontal_filter_pixel_margin < 0) {
        uVar17 = (ulong)uVar2;
      }
      pfVar15 = pfVar21 + lVar16 * uVar14 + lVar11;
      for (; uVar14 != uVar17; uVar14 = uVar14 + 1) {
        for (uVar20 = 0; uVar13 != uVar20; uVar20 = uVar20 + 1) {
          pfVar15[uVar20] = 0.0;
        }
        pfVar15 = pfVar15 + lVar16;
      }
      pfVar21 = pfVar21 + lVar22 * lVar16 + lVar11;
      for (; lVar22 < iVar19; lVar22 = lVar22 + 1) {
        for (uVar17 = 0; uVar13 != uVar17; uVar17 = uVar17 + 1) {
          pfVar21[uVar17] = 0.0;
        }
        pfVar21 = pfVar21 + lVar16;
      }
    }
  }
  return;
}

Assistant:

static void stbir__decode_scanline(stbir__info* stbir_info, int n)
{
    int c;
    int channels = stbir_info->channels;
    int alpha_channel = stbir_info->alpha_channel;
    int type = stbir_info->type;
    int colorspace = stbir_info->colorspace;
    int input_w = stbir_info->input_w;
    size_t input_stride_bytes = stbir_info->input_stride_bytes;
    float* decode_buffer = stbir__get_decode_buffer(stbir_info);
    stbir_edge edge_horizontal = stbir_info->edge_horizontal;
    stbir_edge edge_vertical = stbir_info->edge_vertical;
    size_t in_buffer_row_offset = stbir__edge_wrap(edge_vertical, n, stbir_info->input_h) * input_stride_bytes;
    const void* input_data = (char *) stbir_info->input_data + in_buffer_row_offset;
    int max_x = input_w + stbir_info->horizontal_filter_pixel_margin;
    int decode = STBIR__DECODE(type, colorspace);

    int x = -stbir_info->horizontal_filter_pixel_margin;

    // special handling for STBIR_EDGE_ZERO because it needs to return an item that doesn't appear in the input,
    // and we want to avoid paying overhead on every pixel if not STBIR_EDGE_ZERO
    if (edge_vertical == STBIR_EDGE_ZERO && (n < 0 || n >= stbir_info->input_h))
    {
        for (; x < max_x; x++)
            for (c = 0; c < channels; c++)
                decode_buffer[x*channels + c] = 0;
        return;
    }

    switch (decode)
    {
    case STBIR__DECODE(STBIR_TYPE_UINT8, STBIR_COLORSPACE_LINEAR):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = ((float)((const unsigned char*)input_data)[input_pixel_index + c]) / stbir__max_uint8_as_float;
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_UINT8, STBIR_COLORSPACE_SRGB):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = stbir__srgb_uchar_to_linear_float[((const unsigned char*)input_data)[input_pixel_index + c]];

            if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                decode_buffer[decode_pixel_index + alpha_channel] = ((float)((const unsigned char*)input_data)[input_pixel_index + alpha_channel]) / stbir__max_uint8_as_float;
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_UINT16, STBIR_COLORSPACE_LINEAR):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = ((float)((const unsigned short*)input_data)[input_pixel_index + c]) / stbir__max_uint16_as_float;
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_UINT16, STBIR_COLORSPACE_SRGB):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = stbir__srgb_to_linear(((float)((const unsigned short*)input_data)[input_pixel_index + c]) / stbir__max_uint16_as_float);

            if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                decode_buffer[decode_pixel_index + alpha_channel] = ((float)((const unsigned short*)input_data)[input_pixel_index + alpha_channel]) / stbir__max_uint16_as_float;
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_UINT32, STBIR_COLORSPACE_LINEAR):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = (float)(((double)((const unsigned int*)input_data)[input_pixel_index + c]) / stbir__max_uint32_as_float);
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_UINT32, STBIR_COLORSPACE_SRGB):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = stbir__srgb_to_linear((float)(((double)((const unsigned int*)input_data)[input_pixel_index + c]) / stbir__max_uint32_as_float));

            if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                decode_buffer[decode_pixel_index + alpha_channel] = (float)(((double)((const unsigned int*)input_data)[input_pixel_index + alpha_channel]) / stbir__max_uint32_as_float);
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_FLOAT, STBIR_COLORSPACE_LINEAR):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = ((const float*)input_data)[input_pixel_index + c];
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_FLOAT, STBIR_COLORSPACE_SRGB):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = stbir__srgb_to_linear(((const float*)input_data)[input_pixel_index + c]);

            if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                decode_buffer[decode_pixel_index + alpha_channel] = ((const float*)input_data)[input_pixel_index + alpha_channel];
        }

        break;

    default:
        STBIR_ASSERT(!"Unknown type/colorspace/channels combination.");
        break;
    }

    if (!(stbir_info->flags & STBIR_FLAG_ALPHA_PREMULTIPLIED))
    {
        for (x = -stbir_info->horizontal_filter_pixel_margin; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;

            // If the alpha value is 0 it will clobber the color values. Make sure it's not.
            float alpha = decode_buffer[decode_pixel_index + alpha_channel];
#ifndef STBIR_NO_ALPHA_EPSILON
            if (stbir_info->type != STBIR_TYPE_FLOAT) {
                alpha += STBIR_ALPHA_EPSILON;
                decode_buffer[decode_pixel_index + alpha_channel] = alpha;
            }
#endif
            for (c = 0; c < channels; c++)
            {
                if (c == alpha_channel)
                    continue;

                decode_buffer[decode_pixel_index + c] *= alpha;
            }
        }
    }

    if (edge_horizontal == STBIR_EDGE_ZERO)
    {
        for (x = -stbir_info->horizontal_filter_pixel_margin; x < 0; x++)
        {
            for (c = 0; c < channels; c++)
                decode_buffer[x*channels + c] = 0;
        }
        for (x = input_w; x < max_x; x++)
        {
            for (c = 0; c < channels; c++)
                decode_buffer[x*channels + c] = 0;
        }
    }
}